

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QRect __thiscall QDockAreaLayoutInfo::itemRect(QDockAreaLayoutInfo *this,int index,bool isGap)

{
  Orientation OVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  quintptr qVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  QDockAreaLayoutItem *this_00;
  int iVar13;
  long lVar14;
  QRect QVar15;
  QRect QVar16;
  quintptr qVar6;
  
  lVar14 = (long)index;
  this_00 = (this->item_list).d.ptr + lVar14;
  bVar4 = QDockAreaLayoutItem::skip(this_00);
  QVar15 = (QRect)(ZEXT816(0xffffffff) << 0x40);
  if ((bVar4) || ((isGap && ((this_00->flags & 1) == 0)))) {
    uVar8 = 0;
    uVar9 = 0xffffffff;
  }
  else if (this->tabbed == true) {
    if (!isGap) {
      if (this_00->widgetItem == (QLayoutItem *)0x0) {
        qVar6 = 0;
      }
      else {
        iVar5 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
        qVar6 = CONCAT44(extraout_var,iVar5);
      }
      qVar7 = currentTabId(this);
      uVar8 = 0;
      uVar9 = 0xffffffff;
      QVar15 = (QRect)(ZEXT816(0xffffffff) << 0x40);
      if (qVar6 != qVar7) goto LAB_003f6667;
    }
    QVar15 = tabContentRect(this);
    uVar8 = QVar15._0_8_ >> 0x20;
    uVar9 = QVar15._8_8_ >> 0x20;
  }
  else {
    uVar11 = this_00->pos;
    iVar5 = this_00->size;
    iVar13 = index;
    uVar12 = index;
    if (isGap) {
      do {
        if (iVar13 < 1) {
          iVar13 = -1;
          break;
        }
        bVar4 = QDockAreaLayoutItem::skip((this->item_list).d.ptr + (uVar12 - 1));
        iVar13 = iVar13 + -1;
        uVar12 = uVar12 - 1;
      } while (bVar4);
      lVar3 = lVar14 * 0x28;
      do {
        lVar14 = lVar14 + 1;
        if ((this->item_list).d.size <= lVar14) {
          index = -1;
          break;
        }
        bVar4 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)
                           ((long)&(this->item_list).d.ptr[1].widgetItem + lVar3));
        index = index + 1;
        lVar3 = lVar3 + 0x28;
      } while (bVar4);
      if ((iVar13 != -1) && (((this->item_list).d.ptr[iVar13].flags & 1) == 0)) {
        uVar11 = uVar11 + *this->sep;
        iVar5 = iVar5 - *this->sep;
      }
      if ((index != -1) && (((this->item_list).d.ptr[index].flags & 1) == 0)) {
        iVar5 = iVar5 - *this->sep;
      }
    }
    OVar1 = this->o;
    uVar12 = (this->rect).x1.m_i;
    uVar9 = 0;
    if (OVar1 == Horizontal) {
      uVar9 = (ulong)uVar11;
    }
    uVar2 = (this->rect).y1.m_i;
    iVar13 = -1;
    if (OVar1 == Horizontal) {
      iVar13 = iVar5;
    }
    iVar10 = ((this->rect).y2.m_i - uVar2) + 1;
    if (OVar1 == Vertical) {
      uVar2 = uVar11;
    }
    uVar8 = (ulong)uVar2;
    if (OVar1 == Vertical) {
      uVar9 = (ulong)uVar12;
      iVar10 = iVar5;
      iVar13 = ((this->rect).x2.m_i - uVar12) + 1;
    }
    QVar15.x2.m_i = (int)uVar9 + iVar13 + -1;
    QVar15.x1.m_i = (int)uVar9;
    QVar15.y1.m_i = (int)(uVar9 >> 0x20);
    QVar15.y2.m_i = 0;
    uVar9 = (ulong)((uVar2 + iVar10) - 1);
  }
LAB_003f6667:
  QVar16._0_8_ = QVar15._0_8_ & 0xffffffff | uVar8 << 0x20;
  QVar16._8_8_ = QVar15._8_8_ & 0xffffffff | uVar9 << 0x20;
  return QVar16;
}

Assistant:

QRect QDockAreaLayoutInfo::itemRect(int index, bool isGap) const
{
    const QDockAreaLayoutItem &item = item_list.at(index);

    if (item.skip())
        return QRect();

    if (isGap && !(item.flags & QDockAreaLayoutItem::GapItem))
        return QRect();

    QRect result;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        if (isGap || tabId(item) == currentTabId())
            result = tabContentRect();
    } else
#endif
    {
        int pos = item.pos;
        int size = item.size;

        if (isGap) {
            int prev = this->prev(index);
            int next = this->next(index);
            if (prev != -1 && !(item_list.at(prev).flags & QDockAreaLayoutItem::GapItem)) {
                pos += *sep;
                size -= *sep;
            }
            if (next != -1 && !(item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
                size -= *sep;
        }

        QPoint p;
        rpick(o, p) = pos;
        rperp(o, p) = perp(o, rect.topLeft());
        QSize s;
        rpick(o, s) = size;
        rperp(o, s) = perp(o, rect.size());
        result = QRect(p, s);
    }

    return result;
}